

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O3

Abc_Obj_t * Io_MvParseAddResetCircuit(Io_MvMod_t *p,char *pName)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  long *plVar4;
  Vec_Ptr_t *pVVar5;
  int *piVar6;
  Abc_Obj_t *pObj;
  char *pcVar7;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pFanin_00;
  Io_MvVar_t *pIVar8;
  Io_MvVar_t *pIVar9;
  void *pvVar10;
  Abc_Obj_t *pFanin_01;
  Abc_Ntk_t *pAVar11;
  int iVar12;
  char Buffer [50];
  char local_68 [56];
  
  pAVar3 = p->pResetLatch;
  if (pAVar3 == (Abc_Obj_t *)0x0) {
    __assert_fail("p->pResetLatch != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioReadBlifMv.c"
                  ,0x706,"Abc_Obj_t *Io_MvParseAddResetCircuit(Io_MvMod_t *, char *)");
  }
  plVar4 = (long *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray];
  pAVar3 = *(Abc_Obj_t **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[6] * 8);
  pObj = Abc_NtkFindOrCreateNet(p->pNtk,pName);
  pAVar11 = p->pNtk;
  pcVar7 = Abc_ObjNameSuffix(pObj,"_reset");
  pFanin = Abc_NtkFindOrCreateNet(pAVar11,pcVar7);
  pAVar11 = p->pNtk;
  pcVar7 = Abc_ObjNameSuffix(pObj,"_out");
  pFanin_00 = Abc_NtkFindOrCreateNet(pAVar11,pcVar7);
  pAVar11 = p->pNtk;
  if (0xc < pAVar11->vAttrs->nSize) {
    if (pAVar11->vAttrs->pArray[0xc] == (void *)0x0) {
LAB_0085251e:
      pFanin_01 = Abc_NtkCreateObj(pAVar11,ABC_OBJ_NODE);
      Abc_ObjAddFanin(pObj,pFanin_01);
      if (p->pMan->fBlifMv == 0) {
        pcVar7 = Abc_SopCreateMux((Mem_Flex_t *)p->pNtk->pManFunc);
      }
      else {
        builtin_strncpy(local_68,"1 - - =1\n0 - - =2\n",0x13);
        pcVar7 = Abc_SopRegister((Mem_Flex_t *)p->pNtk->pManFunc,local_68);
      }
      (pFanin_01->field_5).pData = pcVar7;
      Abc_ObjAddFanin(pFanin_01,pAVar3);
      Abc_ObjAddFanin(pFanin_01,pFanin_00);
      Abc_ObjAddFanin(pFanin_01,pFanin);
      return pFanin;
    }
    pIVar8 = (Io_MvVar_t *)Abc_ObjMvVar(pObj);
    pIVar9 = Abc_NtkMvVarDup(p->pNtk,pIVar8);
    pVVar5 = pFanin->pNtk->vAttrs;
    if (0xc < pVVar5->nSize) {
      piVar6 = (int *)pVVar5->pArray[0xc];
      pvVar10 = *(void **)(piVar6 + 2);
      if (pvVar10 == (void *)0x0) {
LAB_008525d2:
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecAtt.h"
                      ,0xe5,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
      }
      if (*(long *)(piVar6 + 8) == 0) {
        iVar1 = pFanin->Id;
        iVar2 = *piVar6;
        if (iVar2 <= iVar1) {
          iVar12 = iVar1 + 10;
          if (iVar1 < iVar2 * 2) {
            iVar12 = iVar2 * 2;
          }
          if (iVar2 < iVar12) {
            pvVar10 = realloc(pvVar10,(long)iVar12 * 8);
            *(void **)(piVar6 + 2) = pvVar10;
            memset((void *)((long)pvVar10 + (long)*piVar6 * 8),0,((long)iVar12 - (long)*piVar6) * 8)
            ;
            *piVar6 = iVar12;
          }
        }
        *(Io_MvVar_t **)((long)pvVar10 + (long)iVar1 * 8) = pIVar9;
        pIVar8 = Abc_NtkMvVarDup(p->pNtk,pIVar8);
        pVVar5 = pFanin_00->pNtk->vAttrs;
        if (pVVar5->nSize < 0xd) goto LAB_008525b3;
        piVar6 = (int *)pVVar5->pArray[0xc];
        pvVar10 = *(void **)(piVar6 + 2);
        if (pvVar10 == (void *)0x0) goto LAB_008525d2;
        if (*(long *)(piVar6 + 8) == 0) {
          iVar1 = pFanin_00->Id;
          iVar2 = *piVar6;
          if (iVar2 <= iVar1) {
            iVar12 = iVar1 + 10;
            if (iVar1 < iVar2 * 2) {
              iVar12 = iVar2 * 2;
            }
            if (iVar2 < iVar12) {
              pvVar10 = realloc(pvVar10,(long)iVar12 * 8);
              *(void **)(piVar6 + 2) = pvVar10;
              memset((void *)((long)pvVar10 + (long)*piVar6 * 8),0,
                     ((long)iVar12 - (long)*piVar6) * 8);
              *piVar6 = iVar12;
            }
          }
          *(Io_MvVar_t **)((long)pvVar10 + (long)iVar1 * 8) = pIVar8;
          pAVar11 = p->pNtk;
          goto LAB_0085251e;
        }
      }
      __assert_fail("p->pFuncStartObj == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecAtt.h"
                    ,0xe6,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
    }
  }
LAB_008525b3:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

static Abc_Obj_t * Io_MvParseAddResetCircuit( Io_MvMod_t * p, char * pName )
{
    char Buffer[50];
    Abc_Obj_t * pNode, * pData0Net, * pData1Net, * pResetLONet, * pOutNet;
    Io_MvVar_t * pVar;
    // make sure the reset latch exists
    assert( p->pResetLatch != NULL );
    // get the reset net
    pResetLONet = Abc_ObjFanout0(Abc_ObjFanout0(p->pResetLatch));
    // get the output net
    pOutNet = Abc_NtkFindOrCreateNet( p->pNtk, pName );
    // get the data nets
    pData0Net = Abc_NtkFindOrCreateNet( p->pNtk, Abc_ObjNameSuffix(pOutNet, "_reset") );
    pData1Net = Abc_NtkFindOrCreateNet( p->pNtk, Abc_ObjNameSuffix(pOutNet, "_out") );
    // duplicate MV variables
    if ( Abc_NtkMvVar(p->pNtk) )
    {
        pVar = (Io_MvVar_t *)Abc_ObjMvVar( pOutNet );
        Abc_ObjSetMvVar( pData0Net, Abc_NtkMvVarDup(p->pNtk, pVar) );
        Abc_ObjSetMvVar( pData1Net, Abc_NtkMvVarDup(p->pNtk, pVar) );
    }
    // create the node
    pNode = Abc_NtkCreateNode( p->pNtk );
    // create the output net
    Abc_ObjAddFanin( pOutNet, pNode );
    // create the function
    if ( p->pMan->fBlifMv )
    {
//        Vec_Att_t * p = Abc_NtkMvVar( pNtk );
//        int nValues = Abc_ObjMvVarNum(pOutNet);
//        sprintf( Buffer, "2 %d %d %d\n1 - - =1\n0 - - =2\n", nValues, nValues, nValues );
        sprintf( Buffer, "1 - - =1\n0 - - =2\n" );
        pNode->pData = Abc_SopRegister( (Mem_Flex_t *)p->pNtk->pManFunc, Buffer );
    }
    else
        pNode->pData = Abc_SopCreateMux( (Mem_Flex_t *)p->pNtk->pManFunc );
    // add nets
    Abc_ObjAddFanin( pNode, pResetLONet );
    Abc_ObjAddFanin( pNode, pData1Net );
    Abc_ObjAddFanin( pNode, pData0Net );
    return pData0Net;
}